

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O3

put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
density::
sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
::try_start_emplace<std::__cxx11::string,std::__cxx11::string>
          (put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          *this,progress_guarantee i_progress_guarantee,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_construction_params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  Allocation push_data;
  Allocation local_60;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  detail::
  LFQueue_Base<density::runtime_type<>,density::basic_default_allocator<65536ul>,density::detail::SpQueue_TailMultiple<density::runtime_type<>,density::basic_default_allocator<65536ul>,density::default_busy_wait>>
  ::try_inplace_allocate<1ul,true,32ul,8ul>(&local_60,this,i_progress_guarantee);
  if ((long *)local_60.m_user_storage == (long *)0x0) {
    local_48.m_queue =
         (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          *)0x0;
    local_48.m_put.m_control_block = (LfQueueControl *)0x0;
    local_48.m_put.m_next_ptr = 0;
    (__return_storage_ptr__->m_put).m_user_storage = (void *)0x0;
    __return_storage_ptr__->m_queue =
         (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          *)0x0;
    (__return_storage_ptr__->m_put).m_control_block = (LfQueueControl *)0x0;
    (__return_storage_ptr__->m_put).m_next_ptr = 0;
  }
  else {
    local_60.m_control_block[1].m_next =
         (uintptr_t)
         detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
         ::s_table;
    *(size_type **)local_60.m_user_storage = (size_type *)((long)local_60.m_user_storage + 0x10);
    pcVar2 = (i_construction_params->_M_dataplus)._M_p;
    paVar1 = &i_construction_params->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      lVar3 = *(long *)((long)&i_construction_params->field_2 + 8);
      *(size_type *)((long)local_60.m_user_storage + 0x10) = paVar1->_M_allocated_capacity;
      *(long *)((long)local_60.m_user_storage + 0x18) = lVar3;
    }
    else {
      *(pointer *)local_60.m_user_storage = pcVar2;
      *(size_type *)((long)local_60.m_user_storage + 0x10) = paVar1->_M_allocated_capacity;
    }
    *(size_type *)((long)local_60.m_user_storage + 8) = i_construction_params->_M_string_length;
    (i_construction_params->_M_dataplus)._M_p = (pointer)paVar1;
    i_construction_params->_M_string_length = 0;
    (i_construction_params->field_2)._M_local_buf[0] = '\0';
    local_48.m_put.m_control_block = local_60.m_control_block;
    local_48.m_put.m_next_ptr = local_60.m_next_ptr;
    (__return_storage_ptr__->m_put).m_user_storage = local_60.m_user_storage;
    (__return_storage_ptr__->m_put).m_control_block = local_60.m_control_block;
    (__return_storage_ptr__->m_put).m_next_ptr = local_60.m_next_ptr;
    __return_storage_ptr__->m_queue =
         (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          *)this;
    local_48.m_queue =
         (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          *)this;
  }
  local_48.m_put.m_user_storage = (void *)0x0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_48);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE>
          try_start_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)) &&
            noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>())))
        {
            auto push_data = Base::template try_inplace_allocate<
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>(i_progress_guarantee);
            if (push_data.m_user_storage == nullptr)
            {
                return put_transaction<ELEMENT_TYPE>();
            }

            constexpr bool is_noexcept =
              std::is_nothrow_constructible<ELEMENT_TYPE, CONSTRUCTION_PARAMS...>::value &&
              noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>()));

            runtime_type * type = nullptr;

            if (is_noexcept)
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            else
            {
                try
                {
                    auto const type_storage = Base::type_after_control(push_data.m_control_block);
                    DENSITY_ASSUME(type_storage != nullptr);
                    type =
                      new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                    DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                    new (push_data.m_user_storage)
                      ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
                }
                catch (...)
                {
                    if (type != nullptr)
                        type->RUNTIME_TYPE::~RUNTIME_TYPE();

                    Base::cancel_put_nodestroy_impl(push_data);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT
                }
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }